

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::removeSceneEventFilter
          (QGraphicsScenePrivate *this,QGraphicsItem *watched,QGraphicsItem *filter)

{
  bool bVar1;
  iterator it;
  iterator iVar2;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this_00;
  long in_FS_OFFSET;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->sceneEventFilters;
  local_30 = watched;
  bVar1 = QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::contains(this_00,&local_30);
  if (bVar1) {
    it._M_node = (_Base_ptr)
                 QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::lowerBound(this_00,&local_30);
    iVar2 = QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::upperBound(this_00,&local_30);
    do {
      if (it._M_node[1]._M_parent == (_Base_ptr)filter) {
        it._M_node = (_Base_ptr)
                     QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::erase(this_00,it._M_node);
      }
      else {
        it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
      }
    } while ((iterator)it._M_node != iVar2.i._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::removeSceneEventFilter(QGraphicsItem *watched, QGraphicsItem *filter)
{
    if (!sceneEventFilters.contains(watched))
        return;

    QMultiMap<QGraphicsItem *, QGraphicsItem *>::Iterator it = sceneEventFilters.lowerBound(watched);
    QMultiMap<QGraphicsItem *, QGraphicsItem *>::Iterator end = sceneEventFilters.upperBound(watched);
    do {
        if (it.value() == filter)
            it = sceneEventFilters.erase(it);
        else
            ++it;
    } while (it != end);
}